

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::ShaderAtomicExchangeCase::getInputs
          (ShaderAtomicExchangeCase *this,int numValues,int stride,void *inputs)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  lVar2 = 0;
  uVar5 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[0];
  do {
    uVar4 = uVar5;
    uVar1 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[lVar2 + 1];
    uVar5 = uVar1 * uVar4;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 2);
  if (0 < numValues / (int)uVar5) {
    iVar6 = 0;
    iVar7 = 0;
    do {
      if (0 < (int)uVar5) {
        uVar3 = 0;
        iVar8 = iVar6;
        do {
          uVar3 = uVar3 + 1;
          *(int *)((long)inputs + (long)iVar8) = (int)uVar3;
          iVar8 = iVar8 + stride;
        } while (uVar5 != uVar3);
      }
      iVar7 = iVar7 + 1;
      iVar6 = iVar6 + uVar4 * stride * uVar1;
    } while (iVar7 != numValues / (int)uVar5);
  }
  return;
}

Assistant:

void getInputs (int numValues, int stride, void* inputs) const
	{
		const int	workGroupSize	= (int)product(m_workGroupSize);
		const int	numWorkGroups	= numValues/workGroupSize;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int groupOffset = groupNdx*workGroupSize;

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
				*(int*)((deUint8*)inputs + stride*(groupOffset+localNdx)) = localNdx+1;
		}
	}